

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * targetSrcList(Parse *pParse,TriggerStep *pStep)

{
  uint uVar1;
  sqlite3 *db;
  Schema *pSVar2;
  SrcList *pSVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  Schema **ppSVar7;
  
  pSVar3 = sqlite3SrcListAppend(pParse->db,(SrcList *)0x0,&pStep->target,(Token *)0x0);
  if (pSVar3 != (SrcList *)0x0) {
    db = pParse->db;
    pSVar2 = pStep->pTrig->pSchema;
    if (pSVar2 == (Schema *)0x0) {
      uVar5 = 0xfff0bdc0;
    }
    else {
      uVar1 = db->nDb;
      if ((int)uVar1 < 1) {
        uVar5 = 0;
      }
      else {
        ppSVar7 = &db->aDb->pSchema;
        uVar4 = 0;
        do {
          uVar5 = uVar4;
          if (*ppSVar7 == pSVar2) break;
          uVar4 = uVar4 + 1;
          ppSVar7 = ppSVar7 + 4;
          uVar5 = (ulong)uVar1;
        } while (uVar1 != uVar4);
      }
    }
    if ((int)uVar5 == 0 || 1 < (int)uVar5) {
      pcVar6 = sqlite3DbStrDup(db,db->aDb[uVar5 & 0xffffffff].zName);
      pSVar3->a[(long)pSVar3->nSrc + -1].zDatabase = pcVar6;
    }
  }
  return pSVar3;
}

Assistant:

static SrcList *targetSrcList(
  Parse *pParse,       /* The parsing context */
  TriggerStep *pStep   /* The trigger containing the target token */
){
  int iDb;             /* Index of the database to use */
  SrcList *pSrc;       /* SrcList to be returned */

  pSrc = sqlite3SrcListAppend(pParse->db, 0, &pStep->target, 0);
  if( pSrc ){
    assert( pSrc->nSrc>0 );
    assert( pSrc->a!=0 );
    iDb = sqlite3SchemaToIndex(pParse->db, pStep->pTrig->pSchema);
    if( iDb==0 || iDb>=2 ){
      sqlite3 *db = pParse->db;
      assert( iDb<pParse->db->nDb );
      pSrc->a[pSrc->nSrc-1].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    }
  }
  return pSrc;
}